

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::GetMainInertiasInMassReference
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double *Jmyy,double *Jmzz,double *Jmyz,
          double *mass_phi,double *Qmy,double *Qmz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar9 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar10 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  EigenMat5x1 J_vec;
  EigenMat5x1 Jm_vec;
  EigenMat5x1 const_vec;
  EigenMat5x5 Acl2cog;
  Product<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>_>,_0>
  local_198;
  double local_178;
  double dStack_170;
  undefined1 local_168 [16];
  double local_158;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  double local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  double local_98;
  double local_90;
  double local_88;
  double local_70;
  double local_68;
  double local_60;
  undefined8 local_48;
  double local_40;
  double local_38;
  undefined1 extraout_var [56];
  
  dVar18 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar18;
  dVar5 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .mu;
  dVar6 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6 * dVar5;
  auVar15 = vfnmadd213sd_fma(auVar15,auVar10,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 * dVar18;
  auVar3 = vfnmadd213sd_fma(auVar12,auVar19,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz;
  auVar2 = vfmsub213sd_fma(auVar10,auVar19,auVar4);
  dVar18 = (auVar3._0_8_ - auVar15._0_8_) * 0.5;
  dVar6 = auVar2._0_8_;
  dVar18 = dVar6 * dVar6 + dVar18 * dVar18;
  dVar5 = 0.0;
  if (0.0 < dVar18) {
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar18;
    auVar2 = vsqrtsd_avx(auVar21,auVar21);
    dVar18 = auVar2._0_8_;
    dVar5 = atan2(dVar6 / dVar18,(auVar15._0_8_ - auVar3._0_8_) / (dVar18 + dVar18));
    dVar5 = dVar5 * -0.5;
  }
  *mass_phi = dVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_120);
  local_120 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.mu;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_120;
  local_108 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.My;
  dStack_100 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.Mz;
  local_120 = local_120 *
              (this->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.Mz;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_120;
  auVar2 = vunpcklpd_avx(auVar9,auVar16);
  local_118 = local_108 * auVar2._0_8_;
  dStack_110 = dStack_100 * auVar2._8_8_;
  local_108 = local_108 * local_118;
  dStack_100 = dStack_100 * local_118;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&local_f8);
  dVar6 = cos(*mass_phi);
  dVar7 = sin(*mass_phi);
  dVar8 = cos(*mass_phi + *mass_phi);
  auVar11._0_8_ = sin(*mass_phi + *mass_phi);
  auVar11._8_56_ = extraout_var;
  local_98 = dVar6 * dVar6;
  local_90 = dVar7 * dVar7;
  auVar22._0_8_ = -dVar7;
  auVar22._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
  auVar28._0_8_ = -auVar11._0_8_;
  auVar28._8_8_ = extraout_var._0_8_ ^ 0x8000000000000000;
  local_d0 = vmovlpd_avx(auVar22);
  dVar18 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
           super_ChBeamSectionEulerAdvancedGeneric.Mz;
  dVar5 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_90;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar5 * -2.0;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar11._0_8_ * dVar18;
  auVar3 = vfmadd231sd_fma(auVar29,auVar24,auVar17);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_98;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar11._0_8_ * -dVar18;
  auVar2 = vfmadd213sd_fma(auVar24,auVar13,auVar20);
  auVar10 = auVar11._0_16_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_98 * dVar18 * -2.0;
  auVar4 = vfmadd231sd_fma(auVar27,auVar23,auVar10);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_90 * dVar18 * -2.0;
  auVar15 = vfnmadd231sd_fma(auVar26,auVar23,auVar10);
  local_e8 = auVar4._0_8_;
  local_c0 = auVar3._0_8_;
  local_48 = vmovlpd_avx(auVar28);
  local_e0 = auVar15._0_8_;
  local_b8 = auVar2._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar8;
  auVar3 = vfnmadd231sd_fma(auVar20,auVar23,auVar25);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar8 * dVar18;
  auVar2 = vfmsub231sd_fma(auVar14,auVar10,auVar23);
  local_d8 = auVar3._0_8_;
  local_88 = auVar11._0_8_ * 0.5;
  local_60 = auVar11._0_8_ * -0.5;
  local_b0 = auVar2._0_8_;
  local_f8 = dVar6;
  local_f0 = dVar7;
  local_c8 = dVar6;
  local_70 = local_90;
  local_68 = local_98;
  local_40 = auVar11._0_8_;
  local_38 = dVar8;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_178);
  local_178 = this->Qy;
  dStack_170 = this->Qz;
  auVar1._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz;
  auVar1._8_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy;
  local_168 = vpermilpd_avx(auVar1,1);
  local_158 = (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_148);
  local_198.m_lhs = (LhsNested)&local_f8;
  local_198.m_rhs.m_lhs = (LhsNested)&local_178;
  local_198.m_rhs.m_rhs = (RhsNested)&local_120;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,5,1,0,5,1>,Eigen::Product<Eigen::Matrix<double,5,5,0,5,5>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,5,1,0,5,1>const,Eigen::Matrix<double,5,1,0,5,1>const>,0>>
            ((Matrix<double,_5,_1,_0,_5,_1> *)&local_148,&local_198);
  *Qmy = local_148;
  *Qmz = local_140;
  *Jmyy = local_138;
  *Jmzz = local_130;
  *Jmyz = local_128;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::GetMainInertiasInMassReference(double& Jmyy,
                                                                            double& Jmzz,
                                                                            double& Jmyz,
                                                                            double& mass_phi,
                                                                            double& Qmy,
                                                                            double& Qmz) {
    // inherit the algorithm from Rayleigh beam class, ignoring Qy,Qz to solve the mass_phi approximately.
    // remove inertia transport
    double Tyy_rot = this->Jyy - this->mu * this->Mz * this->Mz;
    double Tzz_rot = this->Jzz - this->mu * this->My * this->My;
    double Tyz_rot = -this->Jyz + this->mu * this->Mz * this->My;
    // tensor de-rotation up to principal axes
    double argum = pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2);
    if (argum <= 0) {
        mass_phi = 0;
        // Jmyy = 0.5 * (Tzz_rot + Tyy_rot);
        // Jmzz = 0.5 * (Tzz_rot + Tyy_rot);
        // return;
    } else {
        double discr = sqrt(pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2));
        mass_phi = -0.5 * atan2(Tyz_rot / discr, (Tzz_rot - Tyy_rot) / (2. * discr));
        // Jmyy = 0.5 * (Tzz_rot + Tyy_rot) - discr;
        // Jmzz = 0.5 * (Tzz_rot + Tyy_rot) + discr;
    }

    // a constant vector, which is from the mass center offset (My,Mz)
    EigenMat5x1 const_vec;
    const_vec.setZero();
    const_vec(0) = this->mu * this->Mz;
    const_vec(1) = this->mu * this->My;
    const_vec(2) = this->mu * this->Mz * this->Mz;
    const_vec(3) = this->mu * this->My * this->My;
    const_vec(4) = this->mu * this->My * this->Mz;

    // transformation matrix from the centerline of beam to the mass center coordinate system
    EigenMat5x5 Acl2cog;
    Acl2cog.setZero();
    double cosphi = cos(mass_phi);
    double sinphi = sin(mass_phi);
    double cos2phi = cos(2. * mass_phi);
    double sin2phi = sin(2. * mass_phi);
    double cosphi2 = cosphi * cosphi;
    double sinphi2 = sinphi * sinphi;

    Acl2cog(0, 0) = cosphi;
    Acl2cog(0, 1) = -sinphi;

    Acl2cog(1, 0) = sinphi;
    Acl2cog(1, 1) = cosphi;

    Acl2cog(2, 0) = this->My * sin2phi - 2. * this->Mz * cosphi2;
    Acl2cog(2, 1) = -2. * this->My * sinphi2 + this->Mz * sin2phi;
    Acl2cog(2, 2) = cosphi2;
    Acl2cog(2, 3) = sinphi2;
    Acl2cog(2, 4) = -sin2phi;

    Acl2cog(3, 0) = -this->My * sin2phi - 2. * this->Mz * sinphi2;
    Acl2cog(3, 1) = -2. * this->My * cosphi2 - this->Mz * sin2phi;
    Acl2cog(3, 2) = sinphi2;
    Acl2cog(3, 3) = cosphi2;
    Acl2cog(3, 4) = sin2phi;

    Acl2cog(4, 0) = -this->My * cos2phi - this->Mz * sin2phi;
    Acl2cog(4, 1) = this->My * sin2phi - this->Mz * cos2phi;
    Acl2cog(4, 2) = 1. / 2. * sin2phi;
    Acl2cog(4, 3) = -1. / 2. * sin2phi;
    Acl2cog(4, 4) = cos2phi;

    // a vector of mass properties expressed in the centerline of beam
    EigenMat5x1 J_vec;
    J_vec.setZero();

    J_vec(0) = this->Qy;
    J_vec(1) = this->Qz;
    J_vec(2) = this->Jyy;
    J_vec(3) = this->Jzz;
    J_vec(4) = this->Jyz;

    // define a vector of local mass properties expressed in mass center coordinate system
    EigenMat5x1 Jm_vec;
    Jm_vec.setZero();
    Jm_vec = Acl2cog * (J_vec - const_vec);

    Qmy = Jm_vec(0);
    Qmz = Jm_vec(1);
    Jmyy = Jm_vec(2);
    Jmzz = Jm_vec(3);
    Jmyz = Jm_vec(4);
}